

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O2

JL_STATUS MarshallObject(void *Input,JlMarshallElement *Description,JlDataObject **pNewObject)

{
  char *pcVar1;
  JL_NUM_TYPE JVar2;
  JL_STATUS JVar3;
  size_t sVar4;
  uint8_t *InputU8;
  uint64_t NumberU64;
  int64_t NumberS64;
  bool bVar5;
  double NumberF64;
  
  *pNewObject = (JlDataObject *)0x0;
  JVar3 = JL_STATUS_INVALID_TYPE;
  switch(Description->Type) {
  case JL_DATA_TYPE_STRING:
    if (Description->FieldSize == 0) {
      Input = *Input;
    }
    else {
      sVar4 = 0;
      do {
        if (Description->FieldSize == sVar4) {
          return JL_STATUS_STRING_NOT_TERMINATED;
        }
        pcVar1 = (char *)((long)Input + sVar4);
        sVar4 = sVar4 + 1;
      } while (*pcVar1 != '\0');
    }
    JVar3 = JlCreateObject(JL_DATA_TYPE_STRING,pNewObject);
    if ((char *)Input != (char *)0x0 && JVar3 == JL_STATUS_SUCCESS) {
      JVar3 = JlSetObjectString(*pNewObject,(char *)Input);
      return JVar3;
    }
    break;
  case JL_DATA_TYPE_NUMBER:
    JVar2 = Description->NumberType;
    if (JVar2 == JL_NUM_TYPE_FLOAT) {
      if (Description->FieldSize == 4) {
        NumberF64 = (double)*Input;
      }
      else {
        if (Description->FieldSize != 8) {
          return JL_STATUS_INVALID_SPECIFICATION;
        }
        NumberF64 = *Input;
      }
      JVar3 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject);
      if (JVar3 == JL_STATUS_SUCCESS) {
        JVar3 = JlSetObjectNumberF64(*pNewObject,NumberF64);
        return JVar3;
      }
    }
    else if (JVar2 == JL_NUM_TYPE_SIGNED) {
      JVar3 = JL_STATUS_INVALID_SPECIFICATION;
      switch(Description->FieldSize) {
      case 1:
        NumberS64 = (int64_t)*Input;
        break;
      case 2:
        NumberS64 = (int64_t)*Input;
        break;
      default:
        goto switchD_0010519b_caseD_4;
      case 4:
        NumberS64 = (int64_t)*Input;
        break;
      case 8:
        NumberS64 = *Input;
      }
      JVar3 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject);
      if (JVar3 == JL_STATUS_SUCCESS) {
        JVar3 = JlSetObjectNumberS64(*pNewObject,NumberS64);
        return JVar3;
      }
    }
    else if (JVar2 == JL_NUM_TYPE_UNSIGNED) {
      JVar3 = JL_STATUS_INVALID_SPECIFICATION;
      switch(Description->FieldSize) {
      case 1:
        NumberU64 = (uint64_t)*Input;
        break;
      case 2:
        NumberU64 = (uint64_t)*Input;
        break;
      default:
        goto switchD_0010519b_caseD_4;
      case 4:
        NumberU64 = (uint64_t)*Input;
        break;
      case 8:
        NumberU64 = *Input;
      }
      JVar3 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject);
      if (JVar3 == JL_STATUS_SUCCESS) {
        if (Description->IsHex != true) {
          JVar3 = JlSetObjectNumberU64(*pNewObject,NumberU64);
          return JVar3;
        }
        JVar3 = JlSetObjectNumberHex(*pNewObject,NumberU64);
        return JVar3;
      }
    }
    break;
  case JL_DATA_TYPE_BOOL:
    JVar3 = JL_STATUS_INVALID_SPECIFICATION;
    switch(Description->FieldSize) {
    case 1:
      bVar5 = *Input == '\0';
      break;
    case 2:
      bVar5 = *Input == 0;
      break;
    default:
      goto switchD_0010519b_caseD_4;
    case 4:
      bVar5 = *Input == 0;
      break;
    case 8:
      bVar5 = *Input == 0;
    }
    JVar3 = JlCreateObject(JL_DATA_TYPE_BOOL,pNewObject);
    if (JVar3 == JL_STATUS_SUCCESS) {
      JVar3 = JlSetObjectBool(*pNewObject,!bVar5);
      return JVar3;
    }
    break;
  case JL_DATA_TYPE_DICTIONARY:
    JVar3 = JlCreateObject(JL_DATA_TYPE_DICTIONARY,pNewObject);
    if (JVar3 == JL_STATUS_SUCCESS) {
      JVar3 = MarshallDictionary(Input,Description->ChildStructDescription,
                                 (ulong)Description->ChildStructDescriptionCount,*pNewObject);
      return JVar3;
    }
  }
switchD_0010519b_caseD_4:
  return JVar3;
}

Assistant:

static
JL_STATUS
    MarshallObject
    (
        void const*                 Input,
        JlMarshallElement const*    Description,
        JlDataObject**              pNewObject
    )
{
    JL_STATUS jlStatus;

    *pNewObject = NULL;

    if( JL_DATA_TYPE_STRING == Description->Type )
    {
        // Regular allocated string.
        // Input is a pointer to a string.
        jlStatus = MarshallString( Input, Description, pNewObject );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type )
    {
        jlStatus = MarshallNumber( Input, Description, pNewObject );
    }
    else if( JL_DATA_TYPE_BOOL == Description->Type )
    {
        jlStatus = MarshallBool( Input, Description, pNewObject );
    }
    else if (JL_DATA_TYPE_DICTIONARY == Description->Type )
    {
        // This is only called when we are processing dictionary in a list, otherwise dictionaries within
        // dictionaries are processed directly in MarshallDictionary.
        // Dictionaries within a list are always created new, they do not preserve an existing dictionary in
        // the list.
        jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, pNewObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = MarshallDictionary( Input, Description->ChildStructDescription, Description->ChildStructDescriptionCount, *pNewObject );
        }
    }
    else
    {
        // Unknown data type
        jlStatus = JL_STATUS_INVALID_TYPE;
    }

    return jlStatus;
}